

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O3

void asn1::readDER(vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                  vector<asn1::DER,_std::allocator<asn1::DER>_> *v)

{
  size_type *psVar1;
  pair<int,_int> pVar2;
  undefined1 *puVar3;
  long lVar4;
  uint uVar5;
  int l;
  int len;
  size_type __n;
  undefined1 local_f8 [8];
  uint t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [8];
  DER target;
  undefined1 local_70 [8];
  MemBuffer mb;
  MemBuffer mb2;
  
  target.value = (uint64_t)v;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,data);
  mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((undefined1  [8])
      mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != local_70) {
    psVar1 = &target.text._M_string_length;
    do {
      pVar2 = MemBuffer::readDERHead((MemBuffer *)local_70);
      __n = (long)pVar2 >> 0x20;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&mb.readpos,__n,
                 (allocator_type *)local_d8);
      len = pVar2.second;
      if (0 < len) {
        memcpy((void *)mb.readpos,
               (pointer)((long)local_70 +
                        (long)mb.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage),__n);
        mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + __n;
      }
      target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      target.tag = '\0';
      target._1_7_ = 0;
      target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      target.text._M_dataplus._M_p = (pointer)0x0;
      target.text._M_string_length._0_1_ = 0;
      local_d8[0] = pVar2.first._0_1_;
      target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)psVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&mb.readpos);
      target.text.field_2._8_8_ = 0;
      uVar5 = pVar2.first;
      if ((uVar5 & 0xfffffffb) == 0x13) {
        MemBuffer::readString_abi_cxx11_((string *)local_f8,(MemBuffer *)&mb.readpos,len);
        std::__cxx11::string::operator=
                  ((string *)
                   &target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_f8._4_4_,local_f8._0_4_) != &local_e8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_f8._4_4_,local_f8._0_4_),
                          local_e8._M_allocated_capacity + 1);
        }
      }
      else if ((1 < uVar5 - 3) && (uVar5 != 6)) {
        if (uVar5 == 2) {
          if (len == 4) {
            puVar3 = (undefined1 *)(mb.readpos + 3);
            lVar4 = 0;
            do {
              local_f8[lVar4] = *puVar3;
              lVar4 = lVar4 + 1;
              puVar3 = puVar3 + -1;
            } while (lVar4 != 4);
            target.text.field_2._8_8_ = ZEXT48((uint)local_f8._0_4_);
          }
          else if (len == 2) {
            target.text.field_2._8_8_ =
                 ZEXT28((ushort)(*(ushort *)mb.readpos << 8 | *(ushort *)mb.readpos >> 8));
          }
          else if (len == 1) {
            target.text.field_2._8_8_ = ZEXT18(*(byte *)mb.readpos);
          }
        }
        else if (0x2f < (int)uVar5) {
          readDER((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&mb.readpos,
                  (vector<asn1::DER,_std::allocator<asn1::DER>_> *)&target);
        }
      }
      std::vector<asn1::DER,_std::allocator<asn1::DER>_>::push_back
                ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)target.value,
                 (value_type *)local_d8);
      if ((size_type *)
          target.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != psVar1) {
        operator_delete(target.data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        CONCAT71(target.text._M_string_length._1_7_,
                                 (undefined1)target.text._M_string_length) + 1);
      }
      if (target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(target.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)target.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)target.children.
                              super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      }
      std::vector<asn1::DER,_std::allocator<asn1::DER>_>::~vector
                ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)&target);
      if (mb.readpos != 0) {
        operator_delete((void *)mb.readpos,
                        (long)mb2.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - mb.readpos);
      }
    } while (mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
             mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + -(long)local_70);
  }
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70,
                    (long)mb.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_70);
  }
  return;
}

Assistant:

void readDER(const vector<uint8_t>& data, vector<DER>& v)
{
    MemBuffer mb{data};
    while (!mb.done()) {
        auto p = mb.readDERHead();
        MemBuffer mb2 = mb.readBuffer(p.second);

        DER target;

        target.tag = p.first;
        target.data = mb2.buffer();
        target.value = 0;

        if (p.first == 0x13 || p.first == 0x17) {
            target.text = mb2.readString(p.second);
        } else if (p.first == 0x02) {
            switch (p.second) {
            case 1:
                target.value = mb2.read<uint8_t>();
                break;
            case 2:
                target.value = mb2.read<uint16_t>();
                break;
            case 4:
                target.value = mb2.read<uint32_t>();
                break;
            }
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
        } else if (p.first >= 0x30) {
            readDER(mb2.buffer(), target.children);
        } else if (p.first == 5) {
        }
        v.push_back(target);
    }
}